

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

maxint_t * primecount::S1(maxint_t *__return_storage_ptr__,maxint_t x,int threads)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 x_00 [16];
  undefined1 n [16];
  bool bVar5;
  primecount *this;
  maxint_t *pmVar6;
  runtime_error *this_00;
  int in_EDX;
  long extraout_RDX;
  undefined4 in_register_00000034;
  long y;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double alpha_y;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_stack_ffffffffffffff68 [12];
  undefined4 in_stack_ffffffffffffff74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  y = CONCAT44(in_register_00000034,threads);
  if (y < (long)(ulong)(__return_storage_ptr__ == (maxint_t *)0x0)) {
    pmVar6 = (maxint_t *)0x0;
  }
  else {
    auVar14._12_4_ = in_stack_ffffffffffffff74;
    auVar14._0_12_ = in_stack_ffffffffffffff68;
    pmVar6 = __return_storage_ptr__;
    alpha_y = get_alpha_deleglise_rivat((primecount *)__return_storage_ptr__,(maxint_t)auVar14);
    this = (primecount *)get_max_x(pmVar6,alpha_y);
    if ((SBORROW8(extraout_RDX,y) !=
        SBORROW8(extraout_RDX - y,(ulong)(this < __return_storage_ptr__))) !=
        (long)((extraout_RDX - y) - (ulong)(this < __return_storage_ptr__)) < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      n._12_4_ = in_stack_ffffffffffffff74;
      n._0_12_ = in_stack_ffffffffffffff68;
      to_string_abi_cxx11_(&local_70,this,(int128_t)n);
      std::operator+(&local_50,"S1(x): x must be <= ",&local_70);
      std::runtime_error::runtime_error(this_00,(string *)&local_50);
      *(undefined ***)this_00 = &PTR__runtime_error_00185778;
      __cxa_throw(this_00,&primecount_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar5 = is_print();
    if (bVar5) {
      set_print_variables(true);
    }
    dVar12 = (double)__floattidf(__return_storage_ptr__,y);
    cbrt(dVar12);
    auVar13 = __fixdfti();
    if ((long)(ulong)(auVar13._0_8_ == 0) <= auVar13._8_8_) {
      do {
        lVar9 = auVar13._8_8_;
        uVar7 = auVar13._0_8_;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar7;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar7;
        uVar11 = SUB168(auVar1 * auVar3,8) + uVar7 * lVar9 * 2;
        auVar14 = __udivti3(__return_storage_ptr__,y,uVar7,lVar9);
        if (uVar11 <= auVar14._8_8_ &&
            (ulong)(auVar14._0_8_ < SUB168(auVar1 * auVar3,0)) <= auVar14._8_8_ - uVar11)
        goto LAB_0010a50d;
        auVar13._8_8_ = lVar9 + -1 + (ulong)(uVar7 != 0);
        auVar13._0_8_ = uVar7 - 1;
      } while (-lVar9 < (long)(ulong)(1 < uVar7));
      auVar13 = ZEXT816(0);
    }
LAB_0010a50d:
    do {
      lVar8 = auVar13._8_8_;
      uVar11 = auVar13._0_8_;
      uVar7 = uVar11 + 1;
      lVar9 = lVar8 + (ulong)(0xfffffffffffffffe < uVar11);
      auVar13._8_8_ = lVar9;
      auVar13._0_8_ = uVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar7;
      lVar10 = SUB168(auVar2 * auVar4,8) + uVar7 * lVar9 * 2;
      auVar14 = __divti3(__return_storage_ptr__,y,uVar7);
      uVar7 = (ulong)(auVar14._0_8_ < SUB168(auVar2 * auVar4,0));
      lVar9 = auVar14._8_8_ - lVar10;
    } while ((SBORROW8(auVar14._8_8_,lVar10) != SBORROW8(lVar9,uVar7)) == (long)(lVar9 - uVar7) < 0)
    ;
    dVar12 = (double)__floattidf(uVar11,lVar8);
    uVar7 = (ulong)(alpha_y * dVar12);
    uVar11 = 8;
    if (uVar7 < 0x14) {
      uVar11 = (ulong)(byte)(&PhiTiny::pi)[uVar7];
    }
    bVar5 = is_print();
    if (-y < (long)(ulong)((maxint_t *)0x7fffffffffffffff < __return_storage_ptr__)) {
      x_00._12_4_ = in_EDX;
      x_00._0_12_ = in_stack_ffffffffffffff68;
      pmVar6 = S1(__return_storage_ptr__,(int128_t)x_00,y,uVar7,(int)uVar11,SUB41(in_EDX,0));
    }
    else {
      pmVar6 = (maxint_t *)S1((int64_t)__return_storage_ptr__,uVar7,uVar11,in_EDX,bVar5);
    }
  }
  return pmVar6;
}

Assistant:

maxint_t S1(maxint_t x, int threads)
{
  if (x < 1)
    return 0;

  double alpha = get_alpha_deleglise_rivat(x);
  maxint_t limit = get_max_x(alpha);

  if (x > limit)
    throw primecount_error("S1(x): x must be <= " + to_string(limit));

  if (is_print())
    set_print_variables(true);

  int64_t y = (int64_t) (iroot<3>(x) * alpha);
  int64_t c = PhiTiny::get_c(y);

  if (x <= pstd::numeric_limits<int64_t>::max())
    return S1((int64_t) x, y, c, threads);
  else
    return S1(x, y, c, threads);
}